

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  long lVar1;
  ImVec2 IVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 __src [8];
  undefined4 uVar13;
  uint uVar14;
  ImU32 col_upr_right;
  ImU32 IVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 uVar17;
  undefined7 extraout_var_01;
  char *text_end;
  void *pvVar16;
  undefined7 extraout_var_02;
  byte bVar18;
  ImGuiContext *pIVar19;
  int iVar20;
  uint uVar21;
  ImGuiContext *g;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 size;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 IVar28;
  undefined1 this [8];
  char cVar22;
  ImVec2 *out_r;
  long lVar23;
  bool bVar24;
  uint uVar25;
  int iVar26;
  float fVar27;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  int iVar31;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  int iVar32;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  float V;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 picker_pos;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_26c;
  float local_268;
  float local_264;
  undefined4 local_260;
  float local_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  ImVec2 *local_230;
  float local_224;
  float local_220;
  float local_21c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [24];
  ImVec2 local_1f0;
  ImU32 local_1e8;
  ImU32 local_1e4;
  uint local_1e0;
  float local_1dc;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  float local_1c8;
  float fStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  ImVec2 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  ImGuiContext *local_198;
  ImVec2 local_190;
  float local_188;
  float fStack_184;
  uint uStack_180;
  uint uStack_17c;
  ImVec2 local_178;
  float fStack_170;
  float fStack_16c;
  int local_168;
  int local_164;
  uint local_160;
  undefined1 local_150 [8];
  ImVec2 local_148;
  ImVec2 local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ImGuiWindow *local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  undefined1 local_f8 [16];
  ImU32 local_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  ImVec4 local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  size_t local_98;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar34 [16];
  
  pIVar19 = GImGui;
  uStack_210 = local_218;
  local_218 = (undefined1  [8])ref_col;
  local_110 = GImGui->CurrentWindow;
  local_110->WriteAccessed = true;
  if (local_110->SkipItems != false) {
    bVar18 = 0;
    goto LAB_0015f88c;
  }
  uStack_1a0 = local_1a8;
  local_1a8 = (undefined1  [8])local_110->DrawList;
  local_258._0_4_ = CalcItemWidth();
  local_258._4_4_ = extraout_XMM0_Db;
  fStack_250 = (float)extraout_XMM0_Dc;
  fStack_24c = (float)extraout_XMM0_Dd;
  (pIVar19->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar21 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar21);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar14 = pIVar19->ColorEditOptions & 0x6000000;
    uVar25 = 0x2000000;
    if (uVar14 != 0) {
      uVar25 = uVar14;
    }
    uVar21 = uVar21 | uVar25;
  }
  if ((uVar21 & 0x18000000) == 0) {
    uVar14 = pIVar19->ColorEditOptions & 0x18000000;
    uVar25 = 0x8000000;
    if (uVar14 != 0) {
      uVar25 = uVar14;
    }
    uVar21 = uVar21 | uVar25;
  }
  if ((uVar21 & 8) == 0) {
    uVar21 = uVar21 | pIVar19->ColorEditOptions & 0x10000U;
  }
  local_1e0 = uVar21 & 0x10002;
  bVar24 = local_1e0 == 0x10000;
  IVar28 = (local_110->DC).CursorPos;
  local_230 = (ImVec2 *)col;
  local_140 = IVar28;
  local_188 = GetFrameHeight();
  out_r = local_230;
  fVar39 = (pIVar19->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar39);
  fVar39 = (float)local_258._0_4_ - (local_188 + fVar39) * (float)(byte)(bVar24 + 1);
  uVar25 = -(uint)(fVar39 <= local_188);
  fStack_1c4 = (float)(local_258._4_4_ & (uint)extraout_XMM0_Db_00);
  uStack_1c0 = (uint)fStack_250 & extraout_XMM0_Dc_00;
  uStack_1bc = (uint)fStack_24c & extraout_XMM0_Dd_00;
  local_1c8 = (float)(uVar25 & (uint)local_188 | ~uVar25 & (uint)fVar39);
  local_98 = (ulong)((uVar21 & 2) == 0) * 4 + 0xc;
  fStack_184 = extraout_XMM0_Db_00;
  uStack_180 = extraout_XMM0_Dc_00;
  uStack_17c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_230,local_98);
  local_25c = local_1c8 * 0.08;
  local_88 = ZEXT416((uint)(local_1c8 * 0.5));
  local_1d0.x = local_1c8 * 0.5 - local_25c;
  _local_a8 = ZEXT416((uint)local_1d0.x);
  uStack_1b0 = 0;
  local_1dc = IVar28.x;
  local_78._4_4_ = fStack_1c4;
  local_78._0_4_ = local_1c8 + local_1dc;
  uStack_70 = uStack_1c0;
  uStack_6c = uStack_1bc;
  local_258._4_4_ = local_128._4_4_;
  local_258._0_4_ = (float)local_128._0_4_ + local_1c8 + local_1dc;
  fStack_250 = (float)local_128._8_4_;
  fStack_24c = (float)local_128._12_4_;
  local_d8 = (local_188 + local_1c8) * 0.5 + local_1dc;
  fStack_d4 = local_1c8 * 0.5 + IVar28.y;
  fStack_d0 = fStack_184 * 0.0 + 0.0;
  fStack_cc = fStack_1c4 * 0.0 + 0.0;
  local_1f0.y = fStack_d4;
  local_1f0.x = local_d8;
  local_1d0.x = local_1d0.x - (float)(int)(local_1c8 * 0.027);
  local_190.x = local_1d0.x * -0.5;
  local_190.y = local_1d0.x * -0.866025;
  local_1d0.y = 0.0;
  local_1d8.y = local_1d0.x * 0.866025;
  local_26c = out_r->x;
  local_268 = out_r->y;
  local_264 = out_r[1].x;
  local_224 = local_264;
  local_220 = local_268;
  local_21c = local_26c;
  local_1d8.x = local_190.x;
  local_1b8 = IVar28;
  if ((uVar21 >> 0x1b & 1) == 0) {
    this = local_1a8;
    if ((uVar21 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_21c,&local_220,&local_224);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_26c,local_268,local_264,&local_26c,&local_268,&local_264);
    IVar28.x = pIVar19->ColorEditLastColor[0];
    IVar28.y = pIVar19->ColorEditLastColor[1];
    this = local_1a8;
    if (pIVar19->ColorEditLastColor[2] == out_r[1].x && IVar28 == *out_r) {
      if ((local_268 == 0.0) && (!NAN(local_268))) {
        local_26c = pIVar19->ColorEditLastHue;
      }
      if ((local_264 == 0.0) && (!NAN(local_264))) {
        local_268 = pIVar19->ColorEditLastSat;
      }
    }
  }
  local_248._4_4_ = fStack_184;
  local_248._0_4_ = local_188 + (float)local_258._0_4_;
  fStack_240 = (float)uStack_180;
  fStack_23c = (float)uStack_17c;
  PushItemFlag(8,true);
  local_198 = pIVar19;
  if ((uVar21 >> 0x1a & 1) == 0) {
    if ((uVar21 >> 0x19 & 1) == 0) {
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_138._4_12_;
      local_138 = auVar7 << 0x20;
      local_260 = 0;
      auVar5._12_4_ = 0;
      auVar5._0_12_ = local_208._4_12_;
      local_208._0_16_ = auVar5 << 0x20;
      goto LAB_0015e584;
    }
    local_178.y = local_1c8;
    local_178.x = local_1c8;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = local_138._4_12_;
    local_138 = auVar8 << 0x20;
    InvisibleButton("sv",&local_178,0);
    bVar24 = IsItemActive();
    if (bVar24) {
      auVar33._0_4_ = local_1c8 + -1.0;
      IVar28 = (pIVar19->IO).MousePos;
      auVar29._0_4_ = IVar28.x - local_1b8.x;
      auVar29._4_4_ = IVar28.y - local_1b8.y;
      auVar29._8_4_ = 0.0 - (float)uStack_1b0;
      auVar29._12_4_ = 0.0 - uStack_1b0._4_4_;
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      auVar30 = divps(auVar29,auVar33);
      fVar39 = auVar30._4_4_;
      iVar20 = -(uint)(1.0 < auVar30._0_4_);
      iVar26 = -(uint)(1.0 < fVar39);
      auVar35._4_4_ = iVar26;
      auVar35._0_4_ = iVar20;
      auVar35._8_4_ = iVar26;
      auVar35._12_4_ = iVar26;
      auVar34._8_8_ = auVar35._8_8_;
      auVar34._4_4_ = iVar20;
      auVar34._0_4_ = iVar20;
      uVar25 = movmskpd((int)CONCAT71(extraout_var,bVar24),auVar34);
      auVar43 = ZEXT816(0x3f800000);
      if ((uVar25 & 1) == 0) {
        auVar43 = auVar30;
      }
      local_268 = (float)(~-(uint)(auVar30._0_4_ < 0.0) & auVar43._0_4_);
      fVar27 = 0.0;
      if ((uVar25 & 2) == 0) {
        fVar27 = 1.0 - fVar39;
      }
      local_264 = (float)(-(uint)(fVar39 < 0.0) & 0x3f800000 | ~-(uint)(fVar39 < 0.0) & (uint)fVar27
                         );
      local_138._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar25 >> 8),1);
    }
    if ((uVar21 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
    local_178.y = local_1b8.y;
    local_178.x = (float)local_258._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1c8;
    local_178.x = local_188;
    local_260 = 0;
    InvisibleButton("hue",&local_178,0);
    bVar24 = IsItemActive();
    if (!bVar24) {
      local_208._0_4_ = local_138._0_4_;
      goto LAB_0015e584;
    }
    fVar39 = ((pIVar19->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
    local_26c = 1.0;
    if (fVar39 <= 1.0) {
      local_26c = fVar39;
    }
    local_26c = (float)(~-(uint)(fVar39 < 0.0) & (uint)local_26c);
    local_260 = (undefined4)CONCAT71(extraout_var_00,1);
    local_208._0_4_ = (int)CONCAT71(extraout_var_00,1);
  }
  else {
    local_178.y = local_1c8;
    local_178.x = (pIVar19->Style).ItemInnerSpacing.x + local_1c8 + local_188;
    auVar43._12_4_ = 0;
    auVar43._0_12_ = local_138._4_12_;
    local_138 = auVar43 << 0x20;
    InvisibleButton("hsv",&local_178,0);
    bVar24 = IsItemActive();
    local_260 = 0;
    auVar30._12_4_ = 0;
    auVar30._0_12_ = local_208._4_12_;
    local_208._0_16_ = auVar30 << 0x20;
    if (bVar24) {
      fVar44 = (pIVar19->IO).MouseClickedPos[0].x - local_d8;
      fVar42 = (pIVar19->IO).MouseClickedPos[0].y - fStack_d4;
      fVar27 = (pIVar19->IO).MousePos.x - local_d8;
      local_138 = ZEXT416((uint)fVar27);
      fVar39 = (pIVar19->IO).MousePos.y - fStack_d4;
      local_f8 = ZEXT416((uint)fVar39);
      local_b8 = ZEXT416((uint)fVar42);
      local_208._0_16_ = ZEXT416((uint)fVar44);
      fVar42 = fVar44 * fVar44 + fVar42 * fVar42;
      if ((fVar42 < ((float)local_a8._0_4_ + -1.0) * ((float)local_a8._0_4_ + -1.0)) ||
         (((float)local_88._0_4_ + 1.0) * ((float)local_88._0_4_ + 1.0) < fVar42)) {
        local_260 = 0;
      }
      else {
        fVar39 = atan2f(fVar39,fVar27);
        fVar39 = (fVar39 / 3.1415927) * 0.5;
        local_26c = (float)(~-(uint)(fVar39 < 0.0) & (uint)fVar39 |
                           (uint)(fVar39 + 1.0) & -(uint)(fVar39 < 0.0));
        local_260 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_d8 = cosf(local_26c * -2.0 * 3.1415927);
      fStack_d4 = extraout_XMM0_Db_01;
      fStack_d0 = extraout_XMM0_Dc_01;
      fStack_cc = extraout_XMM0_Dd_01;
      fVar39 = sinf(local_26c * -2.0 * 3.1415927);
      fVar27 = -(float)local_b8._0_4_;
      fVar42 = local_d8 * (float)local_b8._0_4_;
      local_b8._4_4_ = extraout_XMM0_Db_02;
      local_b8._0_4_ = fVar39;
      local_b8._8_4_ = extraout_XMM0_Dc_02;
      local_b8._12_4_ = extraout_XMM0_Dd_02;
      local_178.x = local_d8 * (float)local_208._0_4_ + fVar27 * fVar39;
      local_178.y = fVar39 * (float)local_208._0_4_ + fVar42;
      bVar24 = ImTriangleContainsPoint(&local_1d0,&local_190,&local_1d8,&local_178);
      if (bVar24) {
        local_178.x = local_d8 * (float)local_138._0_4_ +
                      -(float)local_f8._0_4_ * (float)local_b8._0_4_;
        local_178.y = (float)local_b8._0_4_ * (float)local_138._0_4_ +
                      local_d8 * (float)local_f8._0_4_;
        bVar24 = ImTriangleContainsPoint(&local_1d0,&local_190,&local_1d8,&local_178);
        if (!bVar24) {
          local_178 = ImTriangleClosestPoint(&local_1d0,&local_190,&local_1d8,&local_178);
        }
        ImTriangleBarycentricCoords
                  (&local_1d0,&local_190,&local_1d8,&local_178,&local_c8.x,(float *)local_150,
                   &local_100.x);
        fVar27 = 1.0 - (float)local_150._0_4_;
        fVar39 = 1.0;
        if (fVar27 <= 1.0) {
          fVar39 = fVar27;
        }
        local_264 = (float)(-(uint)(fVar27 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar27 < 0.0001) & (uint)fVar39);
        fVar27 = local_c8.x / local_264;
        fVar39 = 1.0;
        if (fVar27 <= 1.0) {
          fVar39 = fVar27;
        }
        local_268 = (float)(-(uint)(fVar27 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar27 < 0.0001) & (uint)fVar39);
        uVar17 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_138._0_4_ = (int)CONCAT71(uVar17,1);
        local_208._0_4_ = (int)CONCAT71(uVar17,1);
        pIVar19 = local_198;
      }
      else {
        auVar6._12_4_ = 0;
        auVar6._0_12_ = local_138._4_12_;
        local_138 = auVar6 << 0x20;
        local_208._0_4_ = local_260;
      }
    }
    if ((uVar21 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
LAB_0015e584:
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_248._0_4_;
  if (local_1e0 == 0x10000) {
    local_178.y = local_1b8.y;
    local_178.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1c8;
    local_178.x = local_188;
    InvisibleButton("alpha",&local_178,0);
    bVar24 = IsItemActive();
    if (bVar24) {
      fVar27 = ((pIVar19->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
      fVar39 = 1.0;
      if (fVar27 <= 1.0) {
        fVar39 = fVar27;
      }
      out_r[1].y = (float)(-(uint)(fVar27 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar27 < 0.0) & (uint)(1.0 - fVar39));
      local_208._0_4_ = (int)CONCAT71(extraout_var_01,1);
    }
  }
  PopItemFlag();
  if ((uVar21 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar19->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar21) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar21 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar19->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar21 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_178 = *out_r;
    fStack_170 = out_r[1].x;
    if ((uVar21 & 2) == 0) {
      fStack_16c = out_r[1].y;
    }
    else {
      fStack_16c = 1.0;
    }
    __src = local_218;
    if ((char)uVar21 < '\0') {
      Text("Current");
    }
    size.x = local_188 * 3.0;
    size.y = local_188 * 2.0;
    uStack_210._0_4_ = local_188 * 0.0;
    local_218._0_4_ = size.x;
    local_218._4_4_ = size.y;
    uStack_210._4_4_ = local_188 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_178,uVar21 & 0x180e0040,size);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      local_c8._0_8_ = *(undefined8 *)__src;
      local_c8.z = *(float *)((long)__src + 8);
      if ((uVar21 & 2) == 0) {
        local_c8.w = *(float *)((long)__src + 0xc);
      }
      else {
        local_c8.w = 1.0;
      }
      bVar24 = ColorButton("##original",&local_c8,uVar21 & 0x180e0040,(ImVec2)local_218);
      if (bVar24) {
        pvVar16 = memcpy(out_r,(void *)__src,local_98);
        local_208._0_4_ = (int)CONCAT71((int7)((ulong)pvVar16 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar39 = local_188 * 0.2;
  fVar27 = 0.0;
  fVar42 = 0.0;
  fVar44 = 0.0;
  out_g = &out_r->y;
  out_b = out_r + 1;
  if (((char)local_260 != '\0') || (local_138[0] != '\0')) {
    if ((uVar21 >> 0x1b & 1) == 0) {
      if ((uVar21 >> 0x1c & 1) != 0) {
        out_r->x = local_26c;
        out_r->y = local_268;
        out_r[1].x = local_264;
      }
    }
    else {
      _local_218 = ZEXT416((uint)fVar39);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_26c) & (uint)local_26c |
                        (uint)(local_26c + -1e-05) & -(uint)(1.0 <= local_26c)),
                 (float)(~-(uint)(0.0 < local_268) & 0x3727c5ac |
                        (uint)local_268 & -(uint)(0.0 < local_268)),
                 (float)(~-(uint)(0.0 < local_264) & 0x358637bd |
                        (uint)local_264 & -(uint)(0.0 < local_264)),&out_r->x,out_g,&out_b->x);
      pIVar19->ColorEditLastHue = local_26c;
      pIVar19->ColorEditLastSat = local_268;
      fVar39 = out_r->y;
      pIVar19->ColorEditLastColor[0] = out_r->x;
      pIVar19->ColorEditLastColor[1] = fVar39;
      pIVar19->ColorEditLastColor[2] = out_r[1].x;
      fVar39 = (float)local_218._0_4_;
      fVar27 = (float)local_218._4_4_;
      fVar42 = (float)uStack_210;
      fVar44 = uStack_210._4_4_;
    }
  }
  iVar20 = (int)fVar39;
  iVar26 = (int)fVar27;
  iVar31 = (int)fVar42;
  iVar32 = (int)fVar44;
  if ((uVar21 & 0x20) == 0) {
    local_218._4_4_ = (int)fVar27;
    local_218._0_4_ = (int)fVar39;
    uStack_210._0_4_ = (float)(int)fVar42;
    uStack_210._4_4_ = (float)(int)fVar44;
    fVar39 = (float)local_128._0_4_;
    if (local_1e0 != 0x10000) {
      fVar39 = (float)local_258._0_4_;
    }
    PushItemWidth((fVar39 + local_188) - local_1dc);
    uVar25 = uVar21 & 0x198e001a;
    cVar22 = '\x01';
    if (((uVar21 >> 0x14 & 1) != 0 || (uVar21 & 0x600000) == 0) &&
       (bVar24 = ColorEdit4("##rgb",&local_230->x,uVar25 | 0x100004), bVar24)) {
      local_208._0_4_ = (int)CONCAT71(extraout_var_02,1);
      if (local_198->ActiveId == 0) {
        cVar22 = '\x01';
      }
      else {
        cVar22 = local_198->ActiveIdAllowOverlap;
      }
    }
    if ((uVar21 >> 0x15 & 1) != 0 || (uVar21 & 0x500000) == 0) {
      bVar24 = ColorEdit4("##hsv",&local_230->x,uVar25 | 0x200004);
      auVar43 = local_208._0_16_;
      local_208._1_3_ = local_208._1_3_;
      local_208[0] = local_208[0] | bVar24;
      local_208._4_12_ = auVar43._4_12_;
    }
    if ((uVar21 >> 0x16 & 1) != 0 || (uVar21 & 0x300000) == 0) {
      bVar24 = ColorEdit4("##hex",&local_230->x,uVar25 | 0x400004);
      auVar43 = local_208._0_16_;
      local_208._1_3_ = local_208._1_3_;
      local_208[0] = local_208[0] | bVar24;
      local_208._4_12_ = auVar43._4_12_;
    }
    PopItemWidth();
    out_r = local_230;
    pIVar19 = local_198;
    if ((uVar21 >> 0x1b & 1) != 0 && cVar22 == '\0') {
      ColorConvertRGBtoHSV
                (local_230->x,local_230->y,local_230[1].x,&local_178.x,&local_c8.x,
                 (float *)local_150);
      pIVar19 = local_198;
      this = local_1a8;
      if ((local_178.x <= 0.0) && (0.0 < local_26c)) {
        if (0.0 < (float)local_150._0_4_) {
LAB_0015ead9:
          if (0.0 < local_c8.x) goto LAB_0015eaff;
          fVar39 = local_268 * 0.5;
        }
        else {
          if ((local_264 == (float)local_150._0_4_) &&
             (!NAN(local_264) && !NAN((float)local_150._0_4_))) goto LAB_0015ead9;
          local_150._0_4_ = local_264 * 0.5;
          fVar39 = local_268;
        }
        ColorConvertHSVtoRGB(local_26c,fVar39,(float)local_150._0_4_,&out_r->x,out_g,&out_b->x);
      }
    }
LAB_0015eaff:
    iVar20 = local_218._0_4_;
    iVar26 = local_218._4_4_;
    iVar31 = (int)(float)uStack_210;
    iVar32 = (int)uStack_210._4_4_;
  }
  local_68 = (float)iVar20;
  fStack_64 = (float)iVar26;
  fStack_60 = (float)iVar31;
  fStack_5c = (float)iVar32;
  if (local_208[0] != '\0') {
    if ((uVar21 >> 0x1b & 1) == 0) {
      if ((uVar21 >> 0x1c & 1) != 0) {
        local_26c = out_r->x;
        local_268 = out_r->y;
        local_264 = out_r[1].x;
        ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_21c,&local_220,&local_224);
      }
    }
    else {
      local_21c = out_r->x;
      local_220 = out_r->y;
      local_224 = out_r[1].x;
      ColorConvertRGBtoHSV(local_21c,local_220,local_224,&local_26c,&local_268,&local_264);
      IVar2.x = pIVar19->ColorEditLastColor[0];
      IVar2.y = pIVar19->ColorEditLastColor[1];
      if (pIVar19->ColorEditLastColor[2] == out_r[1].x && IVar2 == *out_r) {
        if ((local_268 == 0.0) && (!NAN(local_268))) {
          local_26c = pIVar19->ColorEditLastHue;
        }
        if ((local_264 == 0.0) && (!NAN(local_264))) {
          local_268 = pIVar19->ColorEditLastSat;
        }
      }
    }
  }
  local_c8.w = (pIVar19->Style).Alpha;
  fVar39 = 1.0;
  if (local_c8.w <= 1.0) {
    fVar39 = local_c8.w;
  }
  iVar20 = (int)((float)(~-(uint)(local_c8.w < 0.0) & (uint)fVar39) * 255.0 + 0.5);
  local_c8.x = 1.0;
  local_c8.y = 1.0;
  local_c8.z = 1.0;
  uVar25 = iVar20 * 0x1000000;
  local_90 = (ulong)uVar25;
  local_168 = uVar25 + 0xff0000;
  uVar14 = iVar20 << 0x18;
  local_160 = uVar14 | 0xff;
  fStack_170 = (float)(iVar20 << 0x18 | 0xff00);
  fStack_16c = (float)(iVar20 << 0x18 | 0xffff00);
  local_218 = (undefined1  [8])(CONCAT44(iVar20 << 0x18,uVar14) | 0xffff000000ff);
  uStack_210._0_4_ = fStack_170;
  uStack_210._4_4_ = fStack_16c;
  local_f8._0_4_ = uVar25 + 0xffffff;
  local_178 = (ImVec2)(CONCAT44(iVar20 << 0x18,uVar14) | 0xffff000000ff);
  local_164 = uVar25 + 0xff00ff;
  local_1e4 = uVar25 + 0x808080;
  ColorConvertHSVtoRGB(local_26c,1.0,1.0,&local_c8.x,&local_c8.y,&local_c8.z);
  col_upr_right = ColorConvertFloat4ToU32(&local_c8);
  local_150._4_4_ = local_220;
  local_150._0_4_ = local_21c;
  local_148.y = (pIVar19->Style).Alpha;
  local_148.x = local_224;
  IVar15 = ColorConvertFloat4ToU32((ImVec4 *)local_150);
  fVar39 = (float)local_218._0_4_;
  local_100.x = 0.0;
  local_100.y = 0.0;
  uVar13 = local_f8._0_4_;
  if ((uVar21 >> 0x1a & 1) == 0) {
    if ((uVar21 >> 0x19 & 1) != 0) {
      local_150._4_4_ = local_1b8.y + local_1c8;
      local_150._0_4_ = local_78._0_4_;
      local_1e8 = IVar15;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_140,(ImVec2 *)local_150,local_f8._0_4_,col_upr_right,
                 col_upr_right,local_f8._0_4_);
      local_1a8._4_4_ = local_1c8;
      local_1a8._0_4_ = local_1c8;
      uStack_1a0._0_4_ = local_1c8;
      uStack_1a0._4_4_ = local_1c8;
      local_150._0_4_ = local_140.x + local_1c8;
      local_150._4_4_ = local_140.y + local_1c8;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_140,(ImVec2 *)local_150,0,0,(ImU32)local_90,
                 (ImU32)local_90);
      p_max.x = (float)local_1a8._0_4_ + local_140.x;
      p_max.y = (float)local_1a8._4_4_ + local_140.y;
      RenderFrameBorder(local_140,p_max,0.0);
      auVar40._4_4_ = 1.0 - local_264;
      auVar40._0_4_ = local_268;
      auVar40._8_8_ = 0;
      auVar43 = minps(_DAT_00176090,auVar40);
      fVar27 = local_140.x;
      fVar42 = local_140.y;
      auVar36._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_268) & auVar43._0_4_) * (float)local_1a8._0_4_
                        + fVar27 + 0.5);
      auVar36._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_264) & auVar43._4_4_) *
                        (float)local_1a8._4_4_ + fVar42 + 0.5);
      auVar36._8_4_ = (float)(int)(auVar43._8_4_ * (float)uStack_1a0 + 0.0 + 0.0);
      auVar36._12_4_ = (float)(int)(auVar43._12_4_ * uStack_1a0._4_4_ + 0.0 + 0.0);
      auVar41._0_4_ = (float)local_1a8._0_4_ + fVar27 + -2.0;
      auVar41._4_4_ = (float)local_1a8._4_4_ + fVar42 + -2.0;
      auVar41._8_4_ = (float)uStack_1a0 + 0.0 + 0.0;
      auVar41._12_4_ = uStack_1a0._4_4_ + 0.0 + 0.0;
      auVar43 = minps(auVar41,auVar36);
      uVar21 = -(uint)(auVar36._0_4_ < fVar27 + 2.0);
      uVar25 = -(uint)(auVar36._4_4_ < fVar42 + 2.0);
      local_100 = (ImVec2)(CONCAT44(~uVar25 & auVar43._4_4_,~uVar21 & auVar43._0_4_) |
                          CONCAT44((uint)(fVar42 + 2.0) & uVar25,(uint)(fVar27 + 2.0) & uVar21));
      local_1a8._4_4_ = fStack_1c4;
      local_1a8._0_4_ = local_1c8 / 6.0;
      uStack_1a0._0_4_ = (float)uStack_1c0;
      uStack_1a0._4_4_ = (float)uStack_1bc;
      lVar23 = 0;
      do {
        local_150._4_4_ = (float)(int)lVar23 * (float)local_1a8._0_4_ + local_140.y;
        local_150._0_4_ = local_258._0_4_;
        lVar1 = lVar23 + 1;
        local_108.y = (float)(int)lVar1 * (float)local_1a8._0_4_ + local_140.y;
        local_108.x = (float)local_248._0_4_;
        fVar27 = (&local_178.y)[lVar23];
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)this,(ImVec2 *)local_150,&local_108,(ImU32)fVar39,(ImU32)fVar39,
                   (ImU32)fVar27,(ImU32)fVar27);
        lVar23 = lVar1;
        fVar39 = fVar27;
      } while (lVar1 != 6);
      _local_1a8 = ZEXT416((uint)(float)(int)(local_26c * local_1c8 + local_140.y + 0.5));
      p_min.y = local_140.y;
      p_min.x = (float)local_258._0_4_;
      p_max_00.y = local_1c8 + local_140.y;
      p_max_00.x = (float)local_248._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_258._0_4_ + -1.0;
      pos.y = (float)local_1a8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar
                ((ImDrawList *)this,pos,half_sz,local_188 + 2.0,(local_198->Style).Alpha);
      out_r = local_230;
      IVar15 = local_1e8;
    }
  }
  else {
    _local_78 = ZEXT416((uint)(0.5 / (float)local_88._0_4_));
    local_d8 = 5.60519e-45;
    if (4 < (int)(float)local_88._0_4_ / 0xc) {
      local_d8 = (float)((int)(float)local_88._0_4_ / 0xc);
    }
    local_b8._4_4_ = 0x80000000;
    local_b8._0_4_ = -(0.5 / (float)local_88._0_4_);
    local_b8._8_4_ = 0x80000000;
    local_b8._12_4_ = 0x80000000;
    local_88._0_4_ = (float)local_88._0_4_ + (float)local_a8._0_4_;
    local_1dc = (float)local_88._0_4_ * 0.5;
    local_a8._4_4_ = local_a8._0_4_;
    fStack_a0 = (float)local_a8._0_4_;
    fStack_9c = (float)local_a8._0_4_;
    lVar23 = 0;
    local_1e8 = IVar15;
    local_dc = col_upr_right;
    do {
      fVar27 = (float)(int)lVar23 / 6.0;
      fVar27 = (fVar27 + fVar27) * 3.1415927 + (float)local_b8._0_4_;
      fVar42 = ((float)(int)lVar23 + 1.0) / 6.0;
      fVar42 = (fVar42 + fVar42) * 3.1415927 + (float)local_78._0_4_;
      local_1b8.x = fVar42;
      iVar20 = (((ImDrawList *)this)->VtxBuffer).Size;
      local_218._0_4_ = fVar27;
      ImDrawList::PathArcTo((ImDrawList *)this,&local_1f0,local_1dc,fVar27,fVar42,(int)local_d8);
      ImDrawList::AddPolyline
                ((ImDrawList *)this,(((ImDrawList *)this)->_Path).Data,
                 (((ImDrawList *)this)->_Path).Size,uVar13,false,local_25c);
      (((ImDrawList *)this)->_Path).Size = 0;
      iVar26 = *(int *)((long)local_1a8 + 0x20);
      _local_248 = ZEXT416((uint)local_1f0.x);
      local_258._0_4_ = cosf((float)local_218._0_4_);
      local_258._4_4_ = extraout_XMM0_Db_03;
      fStack_250 = (float)extraout_XMM0_Dc_03;
      fStack_24c = (float)extraout_XMM0_Dd_03;
      auVar37._4_4_ = local_1f0.y;
      auVar37._0_4_ = local_248._0_4_;
      auVar37._8_4_ = local_248._4_4_;
      auVar37._12_4_ = 0;
      _local_248 = auVar37;
      fVar27 = sinf((float)local_218._0_4_);
      fVar42 = (float)local_258._4_4_ * fStack_a0;
      local_258._4_4_ = fVar27 * (float)local_a8._4_4_ + (float)local_248._4_4_;
      local_258._0_4_ = (float)local_258._0_4_ * (float)local_a8._0_4_ + (float)local_248._0_4_;
      fStack_250 = fVar42 + fStack_240;
      fStack_24c = extraout_XMM0_Db_04 * fStack_9c + fStack_23c;
      _local_248 = ZEXT416((uint)local_1f0.x);
      local_218._0_4_ = cosf(local_1b8.x);
      local_218._4_4_ = extraout_XMM0_Db_05;
      uStack_210._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_210._4_4_ = (float)extraout_XMM0_Dd_04;
      auVar38._4_4_ = local_1f0.y;
      auVar38._0_4_ = local_248._0_4_;
      auVar38._8_4_ = local_248._4_4_;
      auVar38._12_4_ = 0;
      _local_248 = auVar38;
      fVar27 = sinf(local_1b8.x);
      gradient_p1.x = (float)local_218._0_4_ * (float)local_a8._0_4_ + (float)local_248._0_4_;
      gradient_p1.y = fVar27 * (float)local_a8._4_4_ + (float)local_248._4_4_;
      fVar27 = (&local_178.y)[lVar23];
      lVar23 = lVar23 + 1;
      this = local_1a8;
      ShadeVertsLinearColorGradientKeepAlpha
                ((ImDrawList *)local_1a8,iVar20,iVar26,(ImVec2)local_258,gradient_p1,(ImU32)fVar39,
                 (ImU32)fVar27);
      fVar39 = fVar27;
    } while (lVar23 != 6);
    local_258._0_4_ = cosf((local_26c + local_26c) * 3.1415927);
    local_258._4_4_ = extraout_XMM0_Db_06;
    fStack_250 = (float)extraout_XMM0_Dc_05;
    fStack_24c = (float)extraout_XMM0_Dd_05;
    local_248._0_4_ = sinf((local_26c + local_26c) * 3.1415927);
    IVar15 = local_dc;
    out_r = local_230;
    local_248._4_4_ = extraout_XMM0_Db_07;
    fStack_240 = (float)extraout_XMM0_Dc_06;
    fStack_23c = (float)extraout_XMM0_Dd_06;
    local_150._0_4_ = (float)local_258._0_4_ * (float)local_88._0_4_ * 0.5 + local_1f0.x;
    local_150._4_4_ = (float)local_248._0_4_ * (float)local_88._0_4_ * 0.5 + local_1f0.y;
    if ((char)local_260 == '\0') {
      fVar39 = 0.55;
    }
    else {
      fVar39 = 0.65;
    }
    uVar13 = local_f8._0_4_;
    local_25c = local_25c * fVar39;
    iVar20 = 0x20;
    if ((int)(local_25c / 1.4) < 0x20) {
      iVar20 = (int)(local_25c / 1.4);
    }
    iVar26 = 9;
    if (9 < iVar20) {
      iVar26 = iVar20;
    }
    ImDrawList::AddCircleFilled((ImDrawList *)this,(ImVec2 *)local_150,local_25c,local_dc,iVar26);
    ImDrawList::AddCircle
              ((ImDrawList *)this,(ImVec2 *)local_150,local_25c + 1.0,local_1e4,iVar26,1.0);
    ImDrawList::AddCircle((ImDrawList *)this,(ImVec2 *)local_150,local_25c,uVar13,iVar26,1.0);
    uVar11 = local_248._0_4_;
    uVar12 = local_248._4_4_;
    uVar9 = local_258._0_4_;
    uVar10 = local_258._4_4_;
    fVar39 = (float)local_258._4_4_ * 0.0;
    fVar27 = (float)local_258._4_4_ * 0.0;
    local_1b8.x = local_1f0.x;
    local_108.x = local_1d0.x * (float)local_258._0_4_ + -local_1d0.y * (float)local_248._0_4_ +
                  local_1b8.x;
    local_1b8.y = local_1f0.y;
    local_108.y = local_1d0.x * (float)local_248._0_4_ + local_1d0.y * (float)local_258._0_4_ +
                  local_1b8.y;
    local_258._4_4_ = local_108.y;
    local_258._0_4_ = local_108.x;
    fStack_250 = (float)local_248._4_4_ * 0.0 + (float)local_248._4_4_ * -0.0 + 0.0;
    fStack_24c = fVar27 + fVar39 + 0.0;
    fVar39 = (float)local_248._4_4_ * -0.0;
    fVar42 = (float)local_248._4_4_ * 0.0;
    fVar27 = local_190.x * (float)uVar9 + -local_190.y * (float)local_248._0_4_ + local_1b8.x;
    local_248._4_4_ =
         local_190.x * (float)local_248._0_4_ + local_190.y * (float)uVar9 + local_1b8.y;
    local_248._0_4_ = fVar27;
    fStack_240 = fVar42 + fVar39 + 0.0;
    fStack_23c = (float)uVar10 * 0.0 + (float)uVar10 * 0.0 + 0.0;
    local_38.y = (float)local_248._4_4_;
    local_38.x = fVar27;
    local_1b8.x = local_1d8.x * (float)uVar9 + -local_1d8.y * (float)uVar11 + local_1b8.x;
    local_1b8.y = local_1d8.x * (float)uVar11 + local_1d8.y * (float)uVar9 + local_1b8.y;
    uStack_1b0 = CONCAT44((float)uVar10 * 0.0 + (float)uVar10 * 0.0 + 0.0,
                          (float)uVar12 * 0.0 + (float)uVar12 * -0.0 + 0.0);
    local_40.y = local_1b8.y;
    local_40.x = local_1b8.x;
    IVar28 = GetFontTexUvWhitePixel();
    uStack_210 = extraout_XMM0_Qb;
    local_218._0_4_ = IVar28.x;
    local_218._4_4_ = IVar28.y;
    ImDrawList::PrimReserve((ImDrawList *)this,6,6);
    auVar6 = _local_218;
    auVar30 = _local_248;
    auVar43 = _local_258;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)*(uint *)((long)this + 0x34);
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->pos).x = (float)local_258._0_4_;
    (pIVar4->pos).y = (float)local_258._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = IVar15;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar21 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar21;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar21;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_248._0_4_;
    pIVar4[1].pos.y = (float)local_248._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = IVar15;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar21 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar21;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar21;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos = local_1b8;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = uVar13;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar21 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar21;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar21;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_258._0_4_;
    pIVar4[1].pos.y = (float)local_258._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = 0;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar21 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar21;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar21;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_248._0_4_;
    pIVar4[1].pos.y = (float)local_248._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = (ImU32)local_90;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar21 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar21;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar21;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->uv).x = (float)local_218._0_4_;
    (pIVar4->uv).y = (float)local_218._4_4_;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = 0;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    *(uint *)((long)this + 0x34) = *(uint *)((long)this + 0x34) + 1;
    _local_258 = auVar43;
    _local_248 = auVar30;
    _local_218 = auVar6;
    ImDrawList::AddTriangle((ImDrawList *)this,&local_108,&local_38,&local_40,local_1e4,1.5);
    fVar39 = 1.0;
    if (local_268 <= 1.0) {
      fVar39 = local_268;
    }
    fVar39 = (float)(~-(uint)(local_268 < 0.0) & (uint)fVar39);
    fVar42 = 1.0 - local_264;
    fVar27 = 1.0;
    if (fVar42 <= 1.0) {
      fVar27 = fVar42;
    }
    fVar27 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar27);
    fVar42 = fVar39 * (local_108.x - local_40.x) + local_40.x;
    fVar39 = fVar39 * (local_108.y - local_40.y) + local_40.y;
    local_100.x = fVar27 * (local_38.x - fVar42) + fVar42;
    local_100.y = fVar27 * (local_38.y - fVar39) + fVar39;
    IVar15 = local_1e8;
  }
  auVar43 = local_208._0_16_;
  if (local_138[0] == '\0') {
    fVar39 = 6.0;
  }
  else {
    fVar39 = 10.0;
  }
  uVar21 = local_208._0_4_;
  local_258._0_4_ = fVar39;
  ImDrawList::AddCircleFilled((ImDrawList *)this,&local_100,fVar39,IVar15,0xc);
  ImDrawList::AddCircle
            ((ImDrawList *)this,&local_100,(float)local_258._0_4_ + 1.0,local_1e4,0xc,1.0);
  ImDrawList::AddCircle((ImDrawList *)this,&local_100,(float)local_258._0_4_,local_f8._0_4_,0xc,1.0)
  ;
  pIVar19 = local_198;
  if (local_1e0 == 0x10000) {
    fVar39 = out_r[1].y;
    _local_248 = ZEXT416((uint)fVar39);
    fVar27 = 1.0;
    if (fVar39 <= 1.0) {
      fVar27 = fVar39;
    }
    _local_258 = ZEXT416((uint)(1.0 - fVar27));
    local_150._4_4_ = local_140.y;
    local_150._0_4_ = local_128._0_4_;
    local_148.x = (float)local_128._0_4_ + local_188;
    local_148.y = local_140.y + local_1c8;
    RenderColorRectWithAlphaCheckerboard
              ((ImDrawList *)this,(ImVec2)local_150,local_148,0,
               (local_148.x - (float)local_128._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              ((ImDrawList *)this,(ImVec2 *)local_150,&local_148,IVar15,IVar15,IVar15 & 0xffffff,
               IVar15 & 0xffffff);
    local_258._4_4_ = (float)(int)(float)(~local_248._4_4_ & local_258._4_4_);
    local_258._0_4_ =
         (float)(int)((float)(-(uint)((float)local_248._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_248._0_4_ < 0.0) & local_258._0_4_) * local_1c8 +
                      local_140.y + 0.5);
    fStack_250 = (float)(int)(float)(~(uint)fStack_240 & (uint)fStack_250);
    fStack_24c = (float)(int)(float)(~(uint)fStack_23c & (uint)fStack_24c);
    RenderFrameBorder((ImVec2)local_150,local_148,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_258._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar
              ((ImDrawList *)this,pos_00,half_sz_00,local_188 + 2.0,(pIVar19->Style).Alpha);
  }
  EndGroup();
  if (auVar43[0] != '\0') {
    iVar20 = bcmp(local_58,out_r,local_98);
    uVar21 = uVar21 & 0xff;
    if (iVar20 == 0) {
      uVar21 = 0;
    }
  }
  bVar18 = (byte)uVar21;
  if ((uVar21 & 1) != 0) {
    MarkItemEdited((local_110->DC).LastItemId);
  }
  PopID();
LAB_0015f88c:
  return (bool)(bVar18 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10 * 1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}